

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O1

void summaryindex::indexevents
               (string *binfilename,string *idxfilename,
               map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *summaryfileperiod_to_offset,int file_id,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *eventtoperiods)

{
  iterator __position;
  pointer pcVar1;
  int iVar2;
  char *pcVar3;
  _Base_ptr p_Var4;
  vector<long_long,std::allocator<long_long>> *this;
  DIR *__dirp;
  dirent *pdVar5;
  size_t sVar6;
  FILE *pFVar7;
  _Rb_tree_node_base *p_Var8;
  undefined8 extraout_RAX;
  _Base_ptr p_Var9;
  ulong uVar10;
  FILE *__stream;
  _Rb_tree_color _Var11;
  key_type *unaff_RBP;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmVar12;
  string *psVar13;
  FILE *unaff_R13;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *summaryfileperiod_to_offset_00;
  pointer pbVar14;
  bool bVar15;
  longlong offset;
  summarySampleslevelHeader sh;
  summary_period k;
  char line [4096];
  string sStack_1180;
  value_type vStack_1160;
  string *psStack_1140;
  string sStack_1138;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmStack_1118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1110;
  undefined1 auStack_10f8 [32];
  _Rb_tree_node_base *p_Stack_10d8;
  size_t sStack_10d0;
  undefined1 *apuStack_10c8 [2];
  undefined1 auStack_10b8 [16];
  FILE *pFStack_10a8;
  string *psStack_10a0;
  FILE *pFStack_1098;
  string *psStack_1090;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  *pmStack_1088;
  key_type *pkStack_1080;
  FILE *local_1078;
  long local_1070;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_1068;
  FILE *local_1060;
  string *local_1058;
  int local_1050 [3];
  key_type local_1044;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_1038 [85];
  
  pFVar7 = (FILE *)(ulong)(uint)file_id;
  pmVar12 = (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             *)0x10936c;
  pkStack_1080 = (key_type *)0x108283;
  local_1068 = eventtoperiods;
  local_1078 = fopen((idxfilename->_M_dataplus)._M_p,"r");
  if (local_1078 == (FILE *)0x0) {
LAB_00108417:
    pkStack_1080 = (key_type *)0x10841f;
    indexevents((summaryindex *)idxfilename);
  }
  else {
    pmVar12 = (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)0x10936c;
    pkStack_1080 = (key_type *)0x1082a4;
    local_1058 = idxfilename;
    local_1060 = fopen((binfilename->_M_dataplus)._M_p,"r");
    if (local_1060 != (FILE *)0x0) {
      pkStack_1080 = (key_type *)0x1082c9;
      local_1044.fileindex = file_id;
      pcVar3 = fgets((char *)local_1038,0x1000,local_1078);
      if (pcVar3 != (char *)0x0) {
        idxfilename = (string *)&(local_1068->_M_t)._M_impl.super__Rb_tree_header;
        binfilename = (string *)local_1038;
        unaff_RBP = &local_1044;
        do {
          pkStack_1080 = (key_type *)0x1082fe;
          iVar2 = __isoc99_sscanf(binfilename,"%d,%lld",unaff_RBP,&local_1070);
          __stream = local_1060;
          if (iVar2 != 2) {
            pmVar12 = local_1038;
            pkStack_1080 = (key_type *)0x108417;
            indexevents();
            goto LAB_00108417;
          }
          pkStack_1080 = (key_type *)0x10831b;
          fseek(local_1060,local_1070,0);
          pkStack_1080 = (key_type *)0x108332;
          fread(local_1050,0xc,1,__stream);
          p_Var4 = (_Base_ptr)idxfilename;
          for (p_Var9 = (local_1068->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var9 != (_Base_ptr)0x0;
              p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < local_1050[0]]) {
            if (local_1050[0] <= (int)p_Var9[1]._M_color) {
              p_Var4 = p_Var9;
            }
          }
          p_Var9 = (_Base_ptr)idxfilename;
          if ((p_Var4 != (_Base_ptr)idxfilename) &&
             (p_Var9 = p_Var4, local_1050[0] < (int)p_Var4[1]._M_color)) {
            p_Var9 = (_Base_ptr)idxfilename;
          }
          if (p_Var9 != (_Base_ptr)idxfilename) {
            unaff_R13 = (FILE *)p_Var9[1]._M_left;
            for (__stream = (FILE *)p_Var9[1]._M_parent; __stream != unaff_R13;
                __stream = (FILE *)&__stream->field_0x4) {
              local_1044.period_no = __stream->_flags;
              pkStack_1080 = (key_type *)0x10839a;
              this = (vector<long_long,std::allocator<long_long>> *)
                     std::
                     map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     ::operator[](summaryfileperiod_to_offset,unaff_RBP);
              __position._M_current = *(longlong **)(this + 8);
              if (__position._M_current == *(longlong **)(this + 0x10)) {
                pkStack_1080 = (key_type *)0x1083c3;
                std::vector<long_long,std::allocator<long_long>>::
                _M_realloc_insert<long_long_const&>(this,__position,&local_1070);
              }
              else {
                *__position._M_current = local_1070;
                *(longlong **)(this + 8) = __position._M_current + 1;
              }
            }
          }
          pkStack_1080 = (key_type *)0x1083da;
          pcVar3 = fgets((char *)binfilename,0x1000,local_1078);
          pFVar7 = __stream;
        } while (pcVar3 != (char *)0x0);
      }
      pkStack_1080 = (key_type *)0x1083ec;
      fclose(local_1078);
      pkStack_1080 = (key_type *)0x1083f6;
      fclose(local_1060);
      return;
    }
  }
  pkStack_1080 = (key_type *)doit;
  psVar13 = binfilename;
  indexevents((summaryindex *)binfilename);
  vStack_1110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  summaryfileperiod_to_offset_00 =
       (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        *)0x0;
  vStack_1110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_10f8._24_8_ = auStack_10f8 + 8;
  auStack_10f8._8_4_ = _S_red;
  auStack_10f8._16_8_ = (_Base_ptr)0x0;
  sStack_10d0 = 0;
  psStack_1140 = psVar13;
  pmStack_1118 = pmVar12;
  p_Stack_10d8 = (_Rb_tree_node_base *)auStack_10f8._24_8_;
  pFStack_10a8 = pFVar7;
  psStack_10a0 = idxfilename;
  pFStack_1098 = unaff_R13;
  psStack_1090 = binfilename;
  pmStack_1088 = summaryfileperiod_to_offset;
  pkStack_1080 = unaff_RBP;
  __dirp = opendir((psVar13->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
LAB_001088a2:
    doit((summaryindex *)psStack_1140);
LAB_001088ac:
    doit((summaryindex *)&vStack_1160);
  }
  else {
    while( true ) {
      pdVar5 = readdir(__dirp);
      vStack_1160._M_dataplus._M_p = (pointer)&vStack_1160.field_2;
      if (pdVar5 == (dirent *)0x0) break;
      sVar6 = strlen(pdVar5->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&vStack_1160,pdVar5->d_name,pdVar5->d_name + sVar6);
      if (vStack_1160._M_string_length < 5) {
        bVar15 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)apuStack_10c8,(ulong)&vStack_1160);
        iVar2 = std::__cxx11::string::compare((char *)apuStack_10c8);
        bVar15 = iVar2 == 0;
        if (apuStack_10c8[0] != auStack_10b8) {
          operator_delete(apuStack_10c8[0]);
        }
      }
      if (bVar15) {
        sStack_1180._M_dataplus._M_p = (pointer)&sStack_1180.field_2;
        pcVar1 = (psStack_1140->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&sStack_1180,pcVar1,pcVar1 + psStack_1140->_M_string_length);
        std::__cxx11::string::append((char *)&sStack_1180);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&vStack_1110,&vStack_1160);
        sStack_1138._M_dataplus._M_p = (pointer)&sStack_1138.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&sStack_1138,sStack_1180._M_dataplus._M_p,
                   sStack_1180._M_dataplus._M_p + sStack_1180._M_string_length);
        uVar10 = sStack_1180._M_string_length - 4;
        if (sStack_1138._M_string_length < uVar10) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase")
          ;
          goto LAB_001088a2;
        }
        sStack_1138._M_dataplus._M_p[uVar10] = '\0';
        sStack_1138._M_string_length = uVar10;
        std::__cxx11::string::append((char *)&sStack_1138);
        pFVar7 = fopen(sStack_1138._M_dataplus._M_p,"r");
        if (pFVar7 == (FILE *)0x0) {
          indexevents((summaryindex *)&sStack_1180,(string *)auStack_10f8,
                      summaryfileperiod_to_offset_00,(int)pmStack_1118,eventtoperiods);
        }
        else {
          fclose(pFVar7);
          eventtoperiods = pmStack_1118;
          indexevents(&sStack_1180,&sStack_1138,
                      (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       *)auStack_10f8,(int)summaryfileperiod_to_offset_00,pmStack_1118);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_1138._M_dataplus._M_p != &sStack_1138.field_2) {
          operator_delete(sStack_1138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_1180._M_dataplus._M_p != &sStack_1180.field_2) {
          operator_delete(sStack_1180._M_dataplus._M_p);
        }
        summaryfileperiod_to_offset_00 =
             (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              *)(ulong)((int)summaryfileperiod_to_offset_00 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vStack_1160._M_dataplus._M_p != &vStack_1160.field_2) {
        operator_delete(vStack_1160._M_dataplus._M_p);
      }
    }
    pcVar1 = (psStack_1140->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&vStack_1160,pcVar1,pcVar1 + psStack_1140->_M_string_length);
    std::__cxx11::string::append((char *)&vStack_1160);
    pFVar7 = fopen(vStack_1160._M_dataplus._M_p,"wb");
    if (pFVar7 == (FILE *)0x0) goto LAB_001088ac;
    pbVar14 = vStack_1110.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (vStack_1110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        vStack_1110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        fprintf(pFVar7,"%s\n",(pbVar14->_M_dataplus)._M_p);
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 !=
               vStack_1110.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    fclose(pFVar7);
    sStack_1180._M_dataplus._M_p = (pointer)&sStack_1180.field_2;
    pcVar1 = (psStack_1140->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_1180,pcVar1,pcVar1 + psStack_1140->_M_string_length);
    std::__cxx11::string::append((char *)&sStack_1180);
    std::__cxx11::string::operator=((string *)&vStack_1160,(string *)&sStack_1180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_1180._M_dataplus._M_p != &sStack_1180.field_2) {
      operator_delete(sStack_1180._M_dataplus._M_p);
    }
    pFVar7 = fopen(vStack_1160._M_dataplus._M_p,"wb");
    if (pFVar7 != (FILE *)0x0) {
      if ((_Rb_tree_node_base *)auStack_10f8._24_8_ == (_Rb_tree_node_base *)(auStack_10f8 + 8)) {
        _Var11 = _S_red;
      }
      else {
        _Var11 = _S_red;
        p_Var8 = (_Rb_tree_node_base *)auStack_10f8._24_8_;
        do {
          if ((int)_Var11 < (int)p_Var8[1]._M_color) {
            _Var11 = p_Var8[1]._M_color;
          }
          for (p_Var9 = p_Var8[1]._M_left; p_Var9 != p_Var8[1]._M_right;
              p_Var9 = (_Base_ptr)&p_Var9->_M_parent) {
            fprintf(pFVar7,"%d, %d, %d, %lld\n",(ulong)p_Var8[1]._M_color,
                    (ulong)*(uint *)&p_Var8[1].field_0x4,(ulong)*(uint *)&p_Var8[1]._M_parent,
                    *(undefined8 *)p_Var9);
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != (_Rb_tree_node_base *)(auStack_10f8 + 8));
      }
      fclose(pFVar7);
      sStack_1180._M_dataplus._M_p = (pointer)&sStack_1180.field_2;
      pcVar1 = (psStack_1140->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_1180,pcVar1,pcVar1 + psStack_1140->_M_string_length);
      std::__cxx11::string::append((char *)&sStack_1180);
      std::__cxx11::string::operator=((string *)&vStack_1160,(string *)&sStack_1180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_1180._M_dataplus._M_p != &sStack_1180.field_2) {
        operator_delete(sStack_1180._M_dataplus._M_p);
      }
      pFVar7 = fopen(vStack_1160._M_dataplus._M_p,"wb");
      if (pFVar7 != (FILE *)0x0) {
        fprintf(pFVar7,"%d",(ulong)_Var11);
        fclose(pFVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)vStack_1160._M_dataplus._M_p != &vStack_1160.field_2) {
          operator_delete(vStack_1160._M_dataplus._M_p);
        }
        std::
        _Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)auStack_10f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_1110);
        return;
      }
      goto LAB_001088c0;
    }
  }
  doit((summaryindex *)&vStack_1160);
LAB_001088c0:
  doit((summaryindex *)&vStack_1160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1180._M_dataplus._M_p != &sStack_1180.field_2) {
    operator_delete(sStack_1180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vStack_1160._M_dataplus._M_p != &vStack_1160.field_2) {
    operator_delete(vStack_1160._M_dataplus._M_p);
  }
  std::
  _Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<summary_period,_std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *)auStack_10f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_1110);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void indexevents(const std::string &binfilename, std::string &idxfilename, std::map<summary_period, std::vector<long long>> &summaryfileperiod_to_offset, int file_id, const std::map<int, std::vector<int>> &eventtoperiods) {

		FILE * fidx = fopen(idxfilename.c_str(), "r");
		if (fidx == nullptr) {
			fprintf(stderr, "FATAL: Cannot open %s\n", idxfilename.c_str());
			exit(EXIT_FAILURE);
		}
		FILE * fbin = fopen(binfilename.c_str(), "r");
		if (fbin == nullptr) {
			fprintf(stderr, "FATAL: Cannot open %s\n", binfilename.c_str());
			exit(EXIT_FAILURE);
		}

		char line[4096];
		summary_period k;
		k.fileindex = file_id;
		while (fgets(line, sizeof(line), fidx) != 0) {
			long long offset;
			int ret = sscanf(line, "%d,%lld", &k.summary_id, &offset);
			if (ret != 2) {
				fprintf(stderr, "FATAL: Invalid data in file %s:\n%s", idxfilename.c_str(), line);
				exit(EXIT_FAILURE);
			}
			// Get period numbers from event IDs
			flseek(fbin, offset, SEEK_SET);
			summarySampleslevelHeader sh;
			fread(&sh, sizeof(sh), 1, fbin);
			std::map<int, std::vector<int>>::const_iterator iter = eventtoperiods.find(sh.event_id);
			if (iter == eventtoperiods.end()) continue;   // Event not found so don't process it
			for (auto period : iter->second) {
				k.period_no = period;
				summaryfileperiod_to_offset[k].push_back(offset);
			}
		}

		fclose(fidx);
		fclose(fbin);

	}